

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

void do_data(char *infile,char *outfile)

{
  FILE *pFVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  char tempfile [256];
  
  sprintf(tempfile,"%s.%s",outfile,"tmp");
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
    perror(infile);
  }
  else {
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp == (FILE *)0x0) {
      perror(outfile);
      fclose((FILE *)ifp);
    }
    else {
      tfp = (FILE *)fopen(tempfile,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%08lx\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        iVar5 = 0;
LAB_00109a24:
        uVar4 = 0;
LAB_00109a26:
        pcVar2 = fgets(in_line,0x100,(FILE *)ifp);
        pFVar1 = ofp;
        if (pcVar2 != (char *)0x0) goto code_r0x00109a43;
        if (uVar4 != 0) {
          fprintf((FILE *)ofp,"%d\n",(ulong)uVar4);
        }
        pFVar1 = ofp;
        lVar3 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar1,".\n%ld,%d\n",lVar3,0);
        lVar3 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",tempfile);
        iVar5 = fseek((FILE *)tfp,0,0);
        if (iVar5 == 0) {
          while (pcVar2 = fgets(in_line,0x100,(FILE *)tfp), pcVar2 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
          }
          fclose((FILE *)tfp);
          unlink(tempfile);
          sprintf(in_line,"rewind of \"%s\"",outfile);
          iVar5 = fseek((FILE *)ofp,0,0);
          if (iVar5 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",outfile);
            iVar5 = fprintf((FILE *)ofp,"%s%08lx\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",lVar3
                           );
            if (-1 < iVar5) {
              fclose((FILE *)ofp);
              return;
            }
          }
        }
        perror(in_line);
        goto LAB_00109c86;
      }
      perror(tempfile);
      fclose((FILE *)ifp);
LAB_00109c86:
      fclose((FILE *)ofp);
      unlink(outfile);
    }
  }
  exit(1);
code_r0x00109a43:
  if (in_line[0] == '#') goto LAB_00109a26;
  if (in_line[0] < '!') {
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      if (uVar4 == 0) {
        lVar3 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar1,"%ld,",lVar3);
      }
      fputs(in_line,(FILE *)tfp);
      uVar4 = uVar4 + 1;
    }
    goto LAB_00109a26;
  }
  if (uVar4 != 0) {
    fprintf((FILE *)ofp,"%d\n",(ulong)uVar4);
  }
  fputs(in_line,(FILE *)ofp);
  iVar5 = iVar5 + 1;
  goto LAB_00109a24;
}

Assistant:

void do_data(const char *infile, const char *outfile)
{
	char	tempfile[256];
	boolean ok;
	long	txt_offset;
	int	entry_cnt, line_cnt;

	sprintf(tempfile, "%s.%s", outfile, "tmp");

	if (!(ifp = fopen(infile, RDTMODE))) {		/* data.base */
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {	/* data */
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}
	if (!(tfp = fopen(tempfile, WRTMODE))) {	/* data.tmp */
		perror(tempfile);
		fclose(ifp);
		fclose(ofp);
		unlink(outfile);
		exit(EXIT_FAILURE);
	}

	/* output a dummy header record; we'll rewind and overwrite it later */
	fprintf(ofp, "%s%08lx\n", Dont_Edit_Data, 0L);

	entry_cnt = line_cnt = 0;
	/* read through the input file and split it into two sections */
	while (fgets(in_line, sizeof in_line, ifp)) {
	    if (d_filter(in_line)) continue;
	    if (*in_line > ' ') {	/* got an entry name */
		/* first finish previous entry */
		if (line_cnt)  fprintf(ofp, "%d\n", line_cnt),  line_cnt = 0;
		/* output the entry name */
		fputs(in_line, ofp);
		entry_cnt++;		/* update number of entries */
	    } else if (entry_cnt) {	/* got some descriptive text */
		/* update previous entry with current text offset */
		if (!line_cnt)  fprintf(ofp, "%ld,", ftell(tfp));
		/* save the text line in the scratch file */
		fputs(in_line, tfp);
		line_cnt++;		/* update line counter */
	    }
	}
	/* output an end marker and then record the current position */
	if (line_cnt)  fprintf(ofp, "%d\n", line_cnt);
	fprintf(ofp, ".\n%ld,%d\n", ftell(tfp), 0);
	txt_offset = ftell(ofp);
	fclose(ifp);		/* all done with original input file */

	/* reprocess the scratch file; 1st format an error msg, just in case */
	sprintf(in_line, "rewind of \"%s\"", tempfile);
	if (rewind(tfp) != 0)  goto dead_data;
	/* copy all lines of text from the scratch file into the output file */
	while (fgets(in_line, sizeof in_line, tfp))
	    fputs(in_line, ofp);

	/* finished with scratch file */
	fclose(tfp);
	unlink(tempfile);	/* remove it */

	/* update the first record of the output file; prepare error msg 1st */
	sprintf(in_line, "rewind of \"%s\"", outfile);
	ok = (rewind(ofp) == 0);
	if (ok) {
	   sprintf(in_line, "header rewrite of \"%s\"", outfile);
	   ok = (fprintf(ofp, "%s%08lx\n", Dont_Edit_Data, txt_offset) >= 0);
	}
	if (!ok) {
dead_data:  perror(in_line);	/* report the problem */
	    /* close and kill the aborted output file, then give up */
	    fclose(ofp);
	    unlink(outfile);
	    exit(EXIT_FAILURE);
	}

	/* all done */
	fclose(ofp);

	return;
}